

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_batchnorm_scale(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  FILE *__stream;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  reference pvVar14;
  long in_RDI;
  float fVar15;
  int top_blob_index_final;
  int q;
  float *bias;
  float *slope;
  int channels;
  Scale *scale;
  BatchNorm *batchnorm;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  int local_44;
  int local_18;
  int local_10;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28));
  iVar5 = (int)sVar6;
  local_10 = 0;
  do {
    if (iVar5 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
               (long)local_10);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar4) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                           (long)local_10);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      iVar1 = *pvVar8;
      local_18 = local_10;
      do {
        do {
          do {
            local_18 = local_18 + 1;
            if (iVar5 <= local_18) goto LAB_001146dd;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                       (long)local_18);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                    ,(char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                      in_stack_ffffffffffffff88));
          } while (bVar4);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x28),(long)local_18);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
        } while (sVar6 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
      } while (*pvVar8 != iVar1);
LAB_001146dd:
      if (local_18 != iVar5) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_10);
        pLVar2 = *ppLVar7;
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        __stream = _stderr;
        pLVar3 = *ppLVar7;
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_batchnorm_scale %s %s\n",uVar9,uVar10);
        iVar1 = *(int *)&pLVar2[1]._vptr_Layer;
        pfVar11 = ncnn::Mat::operator_cast_to_float_((Mat *)&pLVar2[1].one_blob_only);
        pfVar12 = ncnn::Mat::operator_cast_to_float_((Mat *)((long)&pLVar2[2].name.field_2 + 8));
        for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
          fVar15 = pfVar11[local_44];
          pfVar13 = ncnn::Mat::operator[]((Mat *)&pLVar3[1].one_blob_only,local_44);
          pfVar11[local_44] = fVar15 * *pfVar13;
          if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0) {
            in_stack_ffffffffffffff90 = pfVar12[local_44];
            pfVar13 = ncnn::Mat::operator[]((Mat *)&pLVar3[1].one_blob_only,local_44);
            pfVar12[local_44] = in_stack_ffffffffffffff90 * *pfVar13;
          }
          else {
            in_stack_ffffffffffffff94 = pfVar12[local_44];
            pfVar13 = ncnn::Mat::operator[]((Mat *)&pLVar3[1].one_blob_only,local_44);
            fVar15 = in_stack_ffffffffffffff94 * *pfVar13;
            pfVar13 = ncnn::Mat::operator[]((Mat *)((long)&pLVar3[1].name.field_2 + 8),local_44);
            pfVar12[local_44] = fVar15 + *pfVar13;
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        iVar1 = *pvVar8;
        in_stack_ffffffffffffff88 = iVar1;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
        *pvVar8 = in_stack_ffffffffffffff88;
        in_stack_ffffffffffffff8c = local_10;
        pvVar14 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),
                             (long)iVar1);
        pvVar14->producer = in_stack_ffffffffffffff8c;
        std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_batchnorm_scale()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "BatchNorm")
            continue;

        // BatchNorm - Scale
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Scale")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse BatchNorm - Scale to BatchNorm
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[i];
        ncnn::Scale* scale = (ncnn::Scale*)layers[j];

        fprintf(stderr, "fuse_batchnorm_scale %s %s\n", batchnorm->name.c_str(), scale->name.c_str());

        {
//             v = ((v - mean) / sqrt(var + eps) * slope + bias) * s + b
//               =  (v - mean) / sqrt(var + eps) * (slope * s) + (bias * s + b)

            int channels = batchnorm->channels;

            float* slope = batchnorm->slope_data;
            float* bias = batchnorm->bias_data;

            for (int q=0; q<channels; q++)
            {
                slope[q] = slope[q] * scale->scale_data[q];
                if (scale->bias_term)
                    bias[q] = bias[q] * scale->scale_data[q] + scale->bias_data[q];
                else
                    bias[q] = bias[q] * scale->scale_data[q];
            }
        }

        int top_blob_index_final = scale->tops[0];
        batchnorm->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        scale->type = "ncnnfused";
    }

    return 0;
}